

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  uint p1;
  sqlite3 *db;
  Select *pSVar1;
  Index *pIVar2;
  bool bVar3;
  u16 nPk;
  int iVar4;
  int iVar5;
  int iVar6;
  Table *pTab;
  Trigger *pTrigger;
  Index **ppIVar7;
  Vdbe *p;
  WhereInfo *pWVar8;
  char *zP4;
  u8 *aToOpen;
  VTable *zP4_00;
  Parse *pPVar9;
  ulong uVar10;
  u64 n;
  Index **ppIVar11;
  Expr *pLimit_00;
  int in_R9D;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  int local_108;
  int local_f4;
  Index *local_e8;
  int iDataCur;
  ulong local_b8;
  ulong local_b0;
  int local_a8;
  int iIdxCur;
  ulong local_a0;
  WhereInfo *local_98;
  ulong local_90;
  char *local_88;
  Parse *local_80;
  ulong local_78;
  ulong local_70;
  NameContext local_68;
  
  iDataCur = 0;
  iIdxCur = 0;
  db = pParse->db;
  aToOpen = (u8 *)0x0;
  if (pParse->nErr != 0) goto LAB_0015b46b;
  if ((db->mallocFailed == '\0') &&
     (pTab = sqlite3SrcListLookup(pParse,pTabList), pTab != (Table *)0x0)) {
    pTrigger = sqlite3TriggersExist(pParse,pTab,0x79,(ExprList *)0x0,(int *)0x0);
    pSVar1 = pTab->pSelect;
    bVar14 = true;
    if (pTrigger == (Trigger *)0x0) {
      iVar4 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
      bVar14 = iVar4 != 0;
    }
    iVar4 = sqlite3ViewGetColumnNames(pParse,pTab);
    if ((iVar4 == 0) &&
       (iVar4 = sqlite3IsReadOnly(pParse,pTab,(uint)(pTrigger != (Trigger *)0x0)), iVar4 == 0)) {
      iVar4 = sqlite3SchemaToIndex(db,pTab->pSchema);
      pLimit_00 = (Expr *)db->aDb[iVar4].zDbSName;
      aToOpen = (u8 *)0x0;
      iVar5 = sqlite3AuthCheck(pParse,9,pTab->zName,(char *)0x0,(char *)pLimit_00);
      if (iVar5 == 1) goto LAB_0015b46b;
      p1 = pParse->nTab;
      uVar12 = p1 + 1;
      pParse->nTab = uVar12;
      pTabList->a[0].iCursor = p1;
      n = 2;
      ppIVar11 = &pTab->pIndex;
      ppIVar7 = ppIVar11;
      while (pIVar2 = *ppIVar7, pIVar2 != (Index *)0x0) {
        pParse->nTab = p1 + (int)n;
        n = n + 1;
        ppIVar7 = &pIVar2->pNext;
      }
      if (pSVar1 == (Select *)0x0) {
        local_80 = (Parse *)0x0;
        local_88 = (char *)0x0;
      }
      else {
        local_88 = pParse->zAuthContext;
        pParse->zAuthContext = pTab->zName;
        local_80 = pParse;
      }
      p = sqlite3GetVdbe(pParse);
      if (p == (Vdbe *)0x0) {
LAB_0015b68e:
        aToOpen = (u8 *)0x0;
      }
      else {
        if (pParse->nested == '\0') {
          p->field_0xc5 = p->field_0xc5 | 0x20;
        }
        sqlite3BeginWriteOperation(pParse,(uint)bVar14,iVar4);
        local_b0 = (ulong)uVar12;
        if (pSVar1 != (Select *)0x0) {
          sqlite3MaterializeView(pParse,pTab,pWhere,(ExprList *)(ulong)p1,pLimit_00,in_R9D);
          iDataCur = p1;
          iIdxCur = p1;
        }
        local_68.pWinSelect = (Select *)0x0;
        local_68.nRef = 0;
        local_68.nErr = 0;
        local_68._40_8_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pParse = pParse;
        local_68.pSrcList = pTabList;
        iVar6 = sqlite3ResolveExprNames(&local_68,pWhere);
        uVar10 = 0;
        if (iVar6 != 0) goto LAB_0015b68e;
        local_b8 = uVar10;
        if ((((db->flags & 0x80) != 0) && (pParse->nested == '\0')) &&
           (pParse->pTriggerTab == (Table *)0x0)) {
          uVar12 = pParse->nMem + 1;
          local_b8 = (ulong)uVar12;
          pParse->nMem = uVar12;
          sqlite3VdbeAddOp2(p,0x46,0,uVar12);
        }
        if (((pWhere == (Expr *)0x0 && iVar5 == 0) && bVar14 == 0) && (pTab->nModuleArg == 0)) {
          sqlite3TableLock(pParse,iVar4,pTab->tnum,'\x01',pTab->zName);
          if ((pTab->tabFlags & 0x20) == 0) {
            sqlite3VdbeAddOp4(p,0x89,pTab->tnum,iVar4,-(uint)((uint)local_b8 == 0) | (uint)local_b8,
                              pTab->zName,-1);
          }
          aToOpen = (u8 *)0x0;
          while (pIVar2 = *ppIVar11, pIVar2 != (Index *)0x0) {
            sqlite3VdbeAddOp2(p,0x89,pIVar2->tnum,iVar4);
            ppIVar11 = &pIVar2->pNext;
          }
LAB_0015be22:
          iVar4 = (int)local_b8;
          if ((pParse->nested == '\0') && (pParse->pTriggerTab == (Table *)0x0)) {
            sqlite3AutoincrementEnd(pParse);
            iVar4 = (int)local_b8;
          }
          if (iVar4 != 0) {
            sqlite3VdbeAddOp2(p,0x51,iVar4,1);
            sqlite3VdbeSetNumCols(p,1);
            sqlite3VdbeSetColName(p,0,0,"rows deleted",(_func_void_void_ptr *)0x0);
          }
        }
        else {
          uVar10 = local_68._40_8_ & 0x40;
          if ((pTab->tabFlags & 0x20) == 0) {
            local_a8 = pParse->nMem + 1;
            pParse->nMem = local_a8;
            local_e8 = (Index *)0x0;
            sqlite3VdbeAddOp2(p,0x49,0,local_a8);
            nPk = 1;
            local_108 = 0;
            local_a0 = 0;
            local_f4 = 0;
          }
          else {
            local_e8 = sqlite3PrimaryKeyIndex(pTab);
            nPk = local_e8->nKeyCol;
            uVar12 = pParse->nTab;
            local_a0 = (ulong)uVar12;
            local_108 = pParse->nMem + 1;
            pParse->nMem = pParse->nMem + (int)(short)nPk;
            pParse->nTab = uVar12 + 1;
            local_f4 = sqlite3VdbeAddOp2(p,0x71,uVar12,(int)(short)nPk);
            sqlite3VdbeSetP4KeyInfo(pParse,local_e8);
            local_a8 = 0;
          }
          aToOpen = (u8 *)0x0;
          pWVar8 = sqlite3WhereBegin(pParse,pTabList,pWhere,(ExprList *)0x0,(ExprList *)0x0,
                                     (ushort)(uVar10 == 0 & (bVar14 ^ 1U)) * 8 + 0x414,(int)local_b0
                                    );
          if (pWVar8 != (WhereInfo *)0x0) {
            local_70 = *(ulong *)pWVar8->aiCurOnePass;
            local_b0 = CONCAT71(local_b0._1_7_,pWVar8->eOnePass);
            if (pWVar8->eOnePass != '\x01') {
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->isMultiWrite = '\x01';
            }
            local_90 = local_70 >> 0x20;
            local_98 = pWVar8;
            if ((int)local_b8 != 0) {
              sqlite3VdbeAddOp2(p,0x53,(int)local_b8,1);
            }
            if (local_e8 == (Index *)0x0) {
              local_108 = pParse->nMem + 1;
              pParse->nMem = local_108;
              sqlite3VdbeAddOp2(p,0x80,p1,local_108);
              if ((char)local_b0 == '\0') {
                sqlite3VdbeAddOp2(p,0x94,local_a8,local_108);
                nPk = 1;
                goto LAB_0015bb3b;
              }
LAB_0015b9b0:
              aToOpen = (u8 *)sqlite3DbMallocRawNN(db,n);
              if (aToOpen == (u8 *)0x0) {
                sqlite3WhereEnd(local_98);
                goto LAB_0015b68e;
              }
              memset(aToOpen,1,n - 1);
              aToOpen[n - 1] = '\0';
              if (-1 < (int)local_70) {
                aToOpen[(int)((int)local_70 - p1)] = '\0';
              }
              if (-1 < (long)local_70) {
                aToOpen[(int)((int)local_90 - p1)] = '\0';
              }
              if (local_f4 != 0) {
                sqlite3VdbeChangeToNoop(p,local_f4);
              }
              iVar4 = pParse->nLabel + -1;
              pParse->nLabel = iVar4;
              if (pSVar1 == (Select *)0x0) {
                if ((char)local_b0 != '\x02') {
                  bVar14 = false;
                  goto LAB_0015bb77;
                }
                local_f4 = sqlite3VdbeAddOp0(p,0x11);
                bVar3 = true;
                bVar14 = false;
LAB_0015bb7f:
                sqlite3OpenTableAndIndices(pParse,pTab,0x6d,'\b',p1,aToOpen,&iDataCur,&iIdxCur);
                if (bVar3) {
                  sqlite3VdbeJumpHere(p,local_f4);
                }
                if (bVar14) goto LAB_0015bbdc;
              }
              bVar14 = false;
              if (pTab->nModuleArg == 0) {
                if (aToOpen[(int)(iDataCur - p1)] != '\0') {
                  sqlite3VdbeAddOp4Int(p,0x1c,iDataCur,iVar4,local_108,(int)(short)nPk);
                }
                bVar14 = false;
                iVar5 = 0;
              }
              else {
                iVar5 = 0;
              }
            }
            else {
              uVar12 = (uint)(short)nPk;
              local_78 = (ulong)uVar12;
              uVar13 = 0;
              uVar10 = 0;
              if (0 < (int)uVar12) {
                uVar10 = (ulong)uVar12;
              }
              for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
                sqlite3ExprCodeGetColumnOfTable
                          (p,pTab,p1,(int)local_e8->aiColumn[uVar13],local_108 + (int)uVar13);
              }
              if ((char)local_b0 != '\0') goto LAB_0015b9b0;
              iVar4 = pParse->nMem + 1;
              pParse->nMem = iVar4;
              zP4 = sqlite3IndexAffinityStr(pParse->db,local_e8);
              iVar5 = (int)local_78;
              sqlite3VdbeAddOp4(p,0x5c,local_108,iVar5,iVar4,zP4,iVar5);
              sqlite3VdbeAddOp4Int(p,0x84,(int)local_a0,iVar4,local_108,iVar5);
              nPk = 0;
              local_108 = iVar4;
LAB_0015bb3b:
              sqlite3WhereEnd(local_98);
              aToOpen = (u8 *)0x0;
              if (pSVar1 == (Select *)0x0) {
                bVar14 = true;
                iVar4 = 0;
LAB_0015bb77:
                bVar3 = false;
                local_f4 = 0;
                goto LAB_0015bb7f;
              }
              iVar4 = 0;
LAB_0015bbdc:
              if (local_e8 == (Index *)0x0) {
                iVar5 = sqlite3VdbeAddOp3(p,0x29,local_a8,0,local_108);
              }
              else {
                iVar6 = (int)local_a0;
                iVar5 = sqlite3VdbeAddOp1(p,0x24,iVar6);
                if (pTab->nModuleArg == 0) {
                  sqlite3VdbeAddOp2(p,0x7f,iVar6,local_108);
                }
                else {
                  sqlite3VdbeAddOp3(p,0x5a,iVar6,0,local_108);
                }
              }
              bVar14 = true;
            }
            if (pTab->nModuleArg == 0) {
              sqlite3GenerateRowDelete
                        (pParse,pTab,pTrigger,iDataCur,iIdxCur,local_108,nPk,pParse->nested == '\0',
                         '\v',(u8)local_b0,(int)local_90);
            }
            else {
              zP4_00 = sqlite3GetVTable(db,pTab);
              sqlite3VtabMakeWritable(pParse,pTab);
              pPVar9 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar9 = pParse;
              }
              pPVar9->mayAbort = '\x01';
              if (((char)local_b0 == '\x01') &&
                 (sqlite3VdbeAddOp1(p,0x75,p1), pParse->pToplevel == (Parse *)0x0)) {
                pParse->isMultiWrite = '\0';
              }
              sqlite3VdbeAddOp4(p,10,0,1,local_108,(char *)zP4_00,-0xc);
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
            }
            if (bVar14) {
              if (local_e8 == (Index *)0x0) {
                sqlite3VdbeGoto(p,iVar5);
              }
              else {
                sqlite3VdbeAddOp2(p,5,(int)local_a0,iVar5 + 1);
              }
              sqlite3VdbeJumpHere(p,iVar5);
            }
            else {
              sqlite3VdbeResolveLabel(p,iVar4);
              sqlite3WhereEnd(local_98);
            }
            goto LAB_0015be22;
          }
        }
      }
      if (local_80 != (Parse *)0x0) {
        local_80->zAuthContext = local_88;
      }
      goto LAB_0015b46b;
    }
  }
  aToOpen = (u8 *)0x0;
LAB_0015b46b:
  sqlite3SrcListDelete(db,pTabList);
  sqlite3ExprDelete(db,pWhere);
  sqlite3DbFree(db,aToOpen);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */
 
#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ){
    goto delete_from_cleanup;
  }
  assert( pTabList->nSrc==1 );


  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = pTab->pSelect!=0;
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, (pTrigger?1:0)) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, 
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab, 
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by 
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK|WHERE_SEEK_TABLE;
    if( sNC.ncFlags & NC_VarSelect ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      nPk = 1;
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }
  
    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0, wcf, iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
  
    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }
  
    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }
  
    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
    }
  
    /* If this DELETE cannot use the ONEPASS strategy, this is the 
    ** end of the WHERE loop */
    if( eOnePass!=ONEPASS_OFF ){
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      sqlite3WhereEnd(pWInfo);
    }
  
    /* Unless this is a view, open cursors for the table we are 
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF 
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ) sqlite3VdbeJumpHere(v, iAddrOnce);
    }
  
    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || pTab->pSelect!=0 );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }  
  
    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }
  
    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }     
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is 
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3VdbeAddOp2(v, OP_ResultRow, memCnt, 1);
    sqlite3VdbeSetNumCols(v, 1);
    sqlite3VdbeSetColName(v, 0, COLNAME_NAME, "rows deleted", SQLITE_STATIC);
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) 
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  sqlite3DbFree(db, aToOpen);
  return;
}